

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  z_streamp strm;
  lzx_stream *strm_00;
  char cVar1;
  undefined1 uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  undefined4 *puVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  wchar_t wVar17;
  uint uVar18;
  uint uVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  int64_t iVar25;
  void *pvVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong uVar34;
  char *pcVar35;
  undefined4 uVar36;
  undefined1 *puVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uchar *p;
  int iVar41;
  int *piVar42;
  uint uVar43;
  undefined1 *__dest;
  size_t __n;
  void *pvVar44;
  wchar_t wVar45;
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_164;
  uint local_158;
  uint local_144;
  uint local_13c;
  lzx_br local_d8 [5];
  ulong local_88;
  byte *local_80;
  long local_78;
  ulong local_70;
  uint local_68;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  undefined4 *local_48;
  size_t local_40;
  long local_38;
  
  pvVar23 = a->format->data;
  wVar17 = cab_next_cfdata(a);
  if (wVar17 < L'\0') {
    *avail = (long)wVar17;
    return (void *)0x0;
  }
  lVar8 = *(long *)((long)pvVar23 + 0x28);
  sVar3 = *(short *)(lVar8 + 6);
  if (sVar3 == 3) {
    pvVar23 = a->format->data;
    lVar8 = *(long *)((long)pvVar23 + 0x38);
    if (*(long *)((long)pvVar23 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 == (void *)0x0) {
        pcVar35 = "No memory for CAB reader";
        iVar22 = 0xc;
        goto LAB_001445bd;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    uVar30 = (ulong)uVar4;
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar23 + 0xa0);
      *avail = uVar30 - uVar4;
      return (void *)((ulong)uVar4 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) != '\0') {
LAB_00142f13:
      lVar31 = *(long *)((long)pvVar23 + 0x1b8);
      *(undefined4 *)(lVar31 + 0x70) = 0;
      *(undefined1 *)(lVar31 + 0x75) = 0;
      *(ulong *)((long)pvVar23 + 0x1b0) = uVar30;
      uVar32 = (ulong)*(ushort *)(lVar8 + 8);
      if (uVar4 < *(ushort *)(lVar8 + 8)) {
        strm_00 = (lzx_stream *)((long)pvVar23 + 0x188);
LAB_00142f49:
        *(ulong *)((long)pvVar23 + 0x1a0) = uVar30 + *(long *)((long)pvVar23 + 0xa0);
        *(ulong *)((long)pvVar23 + 0x1a8) = uVar32 - uVar30;
        local_80 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
        if (0 < (long)local_70) {
          uVar30 = (ulong)*(ushort *)(lVar8 + 6);
          if ((long)uVar30 < (long)local_70) {
            local_70 = uVar30;
          }
          uVar32 = local_70;
          *(byte **)((long)pvVar23 + 0x188) = local_80;
          *(ulong *)((long)pvVar23 + 400) = local_70;
          *(undefined8 *)((long)pvVar23 + 0x198) = 0;
          piVar9 = *(int **)((long)pvVar23 + 0x1b8);
          uVar43 = piVar9[0x87];
          if (uVar43 == 0) {
            iVar22 = piVar9[0x1c];
            if ((0 < (long)local_70 && *(char *)((long)piVar9 + 0x75) != '\0') &&
                iVar22 + -0x41 < -0x10) {
              *(ulong *)(piVar9 + 0x1a) =
                   (ulong)*(byte *)(piVar9 + 0x1d) |
                   (ulong)*local_80 << 8 | *(long *)(piVar9 + 0x1a) << 0x10;
              *(byte **)((long)pvVar23 + 0x188) = local_80 + 1;
              *(ulong *)((long)pvVar23 + 400) = local_70 - 1;
              piVar9[0x1c] = iVar22 + 0x10;
              *(undefined1 *)((long)piVar9 + 0x75) = 0;
            }
            iVar22 = (uint)(local_70 == uVar30) * 4 + 1;
            local_68 = (local_70 == uVar30) + 7;
LAB_00143091:
            if (*piVar9 < 0x12) {
              piVar10 = *(int **)((long)pvVar23 + 0x1b8);
              br = (lzx_br *)(piVar10 + 0x1a);
switchD_001430bc_default:
              switch(*piVar10) {
              case 0:
                if (((piVar10[0x1c] < 1) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0'))
                   && (piVar10[0x1c] < 1)) {
                  *piVar10 = 0;
                  goto LAB_001440ba;
                }
                *(bool *)(piVar10 + 10) =
                     (*(ulong *)(piVar10 + 0x1a) >> ((ulong)(piVar10[0x1c] - 1U) & 0x3f) & 1) != 0;
                piVar10[0x1c] = piVar10[0x1c] - 1U;
                break;
              case 2:
                goto switchD_001430bc_caseD_2;
              case 3:
                goto switchD_001430bc_caseD_3;
              case 4:
                goto switchD_001430bc_caseD_4;
              case 5:
              case 6:
              case 7:
                goto switchD_001430bc_caseD_5;
              case 8:
                goto switchD_001430bc_caseD_8;
              case 9:
                goto switchD_001430bc_caseD_9;
              case 10:
                if (((SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                      piVar10[0x1c] + piVar10[0x1e] * -3 < 0) &&
                    (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
                   (SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                    piVar10[0x1c] + piVar10[0x1e] * -3 < 0)) {
                  *piVar10 = 10;
                  goto LAB_001440ba;
                }
                piVar10[0x2b] = 0;
                piVar10[0x2c] = 0;
                piVar10[0x2d] = 0;
                piVar10[0x2e] = 0;
                piVar10[0x27] = 0;
                piVar10[0x28] = 0;
                piVar10[0x29] = 0;
                piVar10[0x2a] = 0;
                piVar10[0x23] = 0;
                piVar10[0x24] = 0;
                piVar10[0x25] = 0;
                piVar10[0x26] = 0;
                piVar10[0x1f] = 0;
                piVar10[0x20] = 0;
                piVar10[0x21] = 0;
                piVar10[0x22] = 0;
                piVar10[0x2f] = 0;
                if (0 < piVar10[0x1e]) {
                  lVar31 = 0;
                  do {
                    *(byte *)(*(long *)(piVar10 + 0x30) + lVar31) =
                         (byte)(*(ulong *)(piVar10 + 0x1a) >> ((char)piVar10[0x1c] - 3U & 0x3f)) & 7
                    ;
                    piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar31) + 0x1f] =
                         piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar31) + 0x1f] + 1;
                    piVar10[0x1c] = piVar10[0x1c] + -3;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < piVar10[0x1e]);
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x1e));
                if (wVar17 == L'\0') goto LAB_001440c6;
switchD_001430bc_caseD_b:
                piVar10[0x86] = 0;
switchD_001430bc_caseD_c:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xc;
                  goto LAB_001440ba;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_001440c6;
                piVar10[0x86] = 0;
switchD_001430bc_caseD_d:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x52),L'Ā');
                if (wVar17 < L'\0') goto LAB_001440c6;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xd;
                  goto LAB_001440ba;
                }
                piVar10[0x86] = 0;
switchD_001430bc_caseD_e:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xe;
                  goto LAB_001440ba;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_001440c6;
                piVar10[0x86] = 0x100;
switchD_001430bc_caseD_f:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x52),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_001440c6;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xf;
                  goto LAB_001440ba;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x52));
                if (wVar17 == L'\0') goto LAB_001440c6;
                piVar10[0x86] = 0;
switchD_001430bc_caseD_10:
                wVar17 = lzx_read_pre_tree(strm_00);
                if (wVar17 == L'\0') {
                  *piVar10 = 0x10;
                  goto LAB_001440ba;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_001440c6;
                piVar10[0x86] = 0;
switchD_001430bc_caseD_11:
                wVar17 = lzx_read_bitlen(strm_00,(huffman *)(piVar10 + 0x38),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_001440c6;
                if (wVar17 == L'\0') {
                  *piVar10 = 0x11;
                  goto LAB_001440ba;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x38));
                if (wVar17 == L'\0') goto LAB_001440c6;
                *piVar10 = 0x12;
                uVar43 = 100;
                goto LAB_0014414e;
              case 0xb:
                goto switchD_001430bc_caseD_b;
              case 0xc:
                goto switchD_001430bc_caseD_c;
              case 0xd:
                goto switchD_001430bc_caseD_d;
              case 0xe:
                goto switchD_001430bc_caseD_e;
              case 0xf:
                goto switchD_001430bc_caseD_f;
              case 0x10:
                goto switchD_001430bc_caseD_10;
              case 0x11:
                goto switchD_001430bc_caseD_11;
              default:
                goto switchD_001430bc_default;
              }
              if ((char)piVar10[10] != '\0') {
                if (((piVar10[0x1c] < 0x20) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')
                    ) && (piVar10[0x1c] < 0x20)) {
                  *piVar10 = 1;
                  goto LAB_001440ba;
                }
                iVar29 = piVar10[0x1c] + -0x20;
                piVar10[9] = (uint)(*(ulong *)(piVar10 + 0x1a) >> ((byte)iVar29 & 0x3f)) & 0xffff |
                             (int)(*(ulong *)(piVar10 + 0x1a) >>
                                  ((char)piVar10[0x1c] - 0x10U & 0x3f)) << 0x10;
                piVar10[0x1c] = iVar29;
              }
switchD_001430bc_caseD_2:
              if (((piVar10[0x1c] < 3) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
                 (piVar10[0x1c] < 3)) {
                *piVar10 = 2;
                goto LAB_001440ba;
              }
              bVar16 = (byte)(*(ulong *)(piVar10 + 0x1a) >> ((byte)(piVar10[0x1c] + -3) & 0x3f)) & 7
              ;
              *(byte *)((long)piVar10 + 0x29) = bVar16;
              piVar10[0x1c] = piVar10[0x1c] + -3;
              if (2 < (byte)(bVar16 - 1)) goto LAB_001440c6;
switchD_001430bc_caseD_3:
              if (((piVar10[0x1c] < 0x18) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0'))
                 && (piVar10[0x1c] < 0x18)) {
                *piVar10 = 3;
                goto LAB_001440ba;
              }
              iVar29 = piVar10[0x1c] + -0x18;
              uVar38 = *(ulong *)(piVar10 + 0x1a) >> ((byte)iVar29 & 0x3f) & 0xffff |
                       (ulong)(((uint)(*(ulong *)(piVar10 + 0x1a) >>
                                      ((char)piVar10[0x1c] - 8U & 0x3f)) & 0xff) << 0x10);
              *(ulong *)(piVar10 + 0xc) = uVar38;
              piVar10[0x1c] = iVar29;
              if (uVar38 == 0) goto LAB_001440c6;
              *(ulong *)(piVar10 + 0xe) = uVar38;
              iVar29 = 0xb;
              if (*(char *)((long)piVar10 + 0x29) != '\x01') {
                if (*(char *)((long)piVar10 + 0x29) == '\x03') goto switchD_001430bc_caseD_4;
                iVar29 = 10;
              }
              *piVar10 = iVar29;
              goto switchD_001430bc_default;
            }
            local_38 = *(long *)((long)pvVar23 + 0x1a8);
            puVar11 = *(undefined4 **)((long)pvVar23 + 0x1b8);
            local_48 = puVar11 + 0x1a;
            local_d8[0].cache_buffer = *(uint64_t *)(puVar11 + 0x1a);
            local_d8[0].cache_avail = puVar11[0x1c];
            local_d8[0]._12_4_ = puVar11[0x1d];
            local_58 = *(long *)(puVar11 + 0x18);
            __dest = *(undefined1 **)((long)pvVar23 + 0x1a0);
            puVar37 = __dest + local_38;
            lVar31 = *(long *)(puVar11 + 4);
            local_60 = *(long *)(puVar11 + 0x30);
            local_50 = *(long *)(puVar11 + 0x4a);
            lVar12 = *(long *)(puVar11 + 100);
            uVar38 = *(ulong *)(puVar11 + 0xe);
            local_78 = (long)(int)puVar11[0x32];
            wVar17 = puVar11[0x4c];
            wVar6 = puVar11[0x66];
            uVar18 = puVar11[8];
            cVar1 = *(char *)((long)puVar11 + 0x29);
            uVar39 = puVar11[6];
            uVar7 = puVar11[2];
            local_64 = puVar11[1];
            uVar19 = puVar11[0x15];
            local_88 = (ulong)(uint)puVar11[0x17];
            local_158 = puVar11[0x16];
            local_164 = puVar11[0x10];
            uVar36 = *puVar11;
            uVar43 = puVar11[7];
            uVar27 = puVar11[0x12];
            uVar14 = puVar11[0x11];
switchD_0014333b_default:
            local_144 = uVar14;
            local_13c = uVar27;
            uVar40 = uVar43;
            uVar33 = uVar36;
            uVar15 = local_164;
            uVar36 = uVar33;
            uVar43 = uVar40;
            uVar27 = local_13c;
            uVar14 = local_144;
            switch(uVar33) {
            case 0x12:
              while( true ) {
                if (uVar38 == 0) {
                  *puVar11 = 2;
                  local_d8[0].cache_buffer._4_4_ = (undefined4)(local_d8[0].cache_buffer >> 0x20);
                  *local_48 = (int)local_d8[0].cache_buffer;
                  local_48[1] = local_d8[0].cache_buffer._4_4_;
                  local_48[2] = local_d8[0].cache_avail;
                  local_48[3] = local_d8[0]._12_4_;
                  *(undefined8 *)(puVar11 + 0xe) = 0;
                  puVar11[8] = uVar18;
                  puVar11[7] = uVar40;
                  puVar11[0x15] = uVar19;
                  puVar11[0x16] = local_158;
                  puVar11[0x10] = local_164;
                  puVar11[0x11] = local_144;
                  puVar11[0x12] = local_13c;
                  puVar11[6] = uVar39;
                  *(long *)((long)pvVar23 + 0x1a8) = (long)puVar37 - (long)__dest;
                  uVar43 = 1;
                  goto LAB_0014412c;
                }
                if (puVar37 <= __dest) goto LAB_00143a7a;
                if (((local_d8[0].cache_avail < wVar6) &&
                    (wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 == L'\0')) &&
                   (local_d8[0].cache_avail < wVar6)) {
                  if (uVar32 != uVar30) goto LAB_00143a7a;
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer <<
                                         ((char)wVar6 - (char)local_d8[0].cache_avail & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar34 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar34 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar34);
                  if (local_d8[0].cache_avail < L'\0') goto LAB_00144117;
                }
                else {
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer >>
                                         ((char)local_d8[0].cache_avail - (char)wVar6 & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar34 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar34 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar34);
                }
                uVar43 = (uint)uVar34;
                if (0xff < uVar43) break;
                *(char *)(lVar31 + (int)uVar39) = (char)uVar34;
                uVar39 = uVar39 + 1 & uVar7;
                *__dest = (char)uVar34;
                __dest = __dest + 1;
                uVar38 = uVar38 - 1;
              }
              uVar19 = uVar43 & 7;
              local_158 = uVar43 - 0x100 >> 3;
              break;
            case 0x13:
              break;
            case 0x14:
              goto LAB_00143649;
            case 0x15:
              goto switchD_0014333b_caseD_15;
            case 0x16:
              goto switchD_0014333b_caseD_16;
            default:
              goto switchD_0014333b_default;
            }
            if (uVar19 == 7) {
              if (((wVar17 <= local_d8[0].cache_avail) ||
                  (wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 != L'\0')) ||
                 (wVar17 <= local_d8[0].cache_avail)) {
                uVar4 = *(ushort *)
                         (*(long *)(puVar11 + 0x50) +
                         (ulong)((uint)(local_d8[0].cache_buffer >>
                                       ((char)local_d8[0].cache_avail - (char)wVar17 & 0x3fU)) &
                                cache_masks[wVar17]) * 2);
                uVar34 = (ulong)uVar4;
                if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                  uVar34 = 0;
                }
                iVar29 = (int)uVar34;
                local_d8[0].cache_avail =
                     local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar34);
LAB_001435b6:
                uVar18 = iVar29 + 9;
                goto LAB_001435b9;
              }
              if (uVar32 != uVar30) {
                uVar33 = 0x13;
                uVar19 = 7;
                goto LAB_00143a7a;
              }
              uVar4 = *(ushort *)
                       (*(long *)(puVar11 + 0x50) +
                       (ulong)((uint)(local_d8[0].cache_buffer <<
                                     ((char)wVar17 - (char)local_d8[0].cache_avail & 0x3fU)) &
                              cache_masks[wVar17]) * 2);
              uVar34 = (ulong)uVar4;
              if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                uVar34 = 0;
              }
              iVar29 = (int)uVar34;
              local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar34)
              ;
              if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_001435b6;
            }
            else {
              uVar18 = uVar19 + 2;
LAB_001435b9:
              if ((ulong)(long)(int)uVar18 <= uVar38) goto code_r0x001435ca;
            }
            goto LAB_00144117;
          }
          goto LAB_0014416f;
        }
        pcVar35 = "Truncated CAB file data";
        goto LAB_0014475c;
      }
LAB_001441bf:
      if (*(short *)(lVar8 + 6) == 0) {
LAB_00144210:
        if ((10 < (ulong)*(ushort *)(lVar8 + 8)) &&
           (lVar31 = *(long *)((long)pvVar23 + 0x1b8), *(char *)(lVar31 + 0x28) != '\0')) {
          pvVar24 = *(void **)((long)pvVar23 + 0xa0);
          pvVar44 = (void *)((long)pvVar24 + ((ulong)*(ushort *)(lVar8 + 8) - 10));
          if (pvVar24 < pvVar44) {
            iVar22 = *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58);
            pvVar26 = pvVar24;
            do {
              pvVar26 = memchr(pvVar26,0xe8,(long)pvVar44 - (long)pvVar26);
              if (pvVar26 == (void *)0x0) break;
              iVar29 = ((int)pvVar24 - (int)pvVar26) + iVar22 * -0x8000 + 0x8000;
              uVar18 = (uint)*(byte *)((long)pvVar26 + 4) << 0x18;
              uVar43 = (uint)*(byte *)((long)pvVar26 + 2) << 8 |
                       (uint)*(byte *)((long)pvVar26 + 3) << 0x10 |
                       (uint)*(byte *)((long)pvVar26 + 1) | uVar18;
              if ((iVar29 <= (int)uVar43) &&
                 (iVar28 = *(int *)(lVar31 + 0x24), (int)uVar43 < iVar28)) {
                if ((int)uVar18 < 0) {
                  iVar29 = iVar28;
                }
                *(uint *)((long)pvVar26 + 1) = iVar29 + uVar43;
              }
              pvVar26 = (void *)((long)pvVar26 + 5);
            } while (pvVar26 < pvVar44);
          }
        }
        uVar4 = *(ushort *)(lVar8 + 0xe);
        lVar31 = *(long *)((long)pvVar23 + 0xa0);
        *avail = (uVar30 & 0xffff) - (ulong)uVar4;
        *(short *)(lVar8 + 0xc) = (short)uVar30;
        return (void *)(lVar31 + (ulong)uVar4);
      }
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        pcVar35 = "Truncated CAB header";
LAB_0014475c:
        archive_set_error(&a->archive,0x54,pcVar35);
      }
      else {
        *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
        *(void **)(lVar8 + 0x38) = pvVar24;
        iVar25 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
        if (-1 < iVar25) goto LAB_00144210;
      }
LAB_00144783:
      *avail = -0x1e;
LAB_001446bb:
      return (void *)0x0;
    }
    uVar5 = *(ushort *)(*(long *)((long)pvVar23 + 0x28) + 8);
    if (*(long *)((long)pvVar23 + 0x1b8) == 0) {
      pvVar24 = calloc(1,0x220);
      *(void **)((long)pvVar23 + 0x1b8) = pvVar24;
      if (pvVar24 != (void *)0x0) goto LAB_001443bb;
    }
    else {
LAB_001443bb:
      puVar11 = *(undefined4 **)((long)pvVar23 + 0x1b8);
      puVar11[0x87] = 0xffffffe7;
      if (0xfffffff8 < uVar5 - 0x16) {
        puVar11[0x87] = 0xffffffe2;
        iVar22 = puVar11[1];
        uVar43 = slots[uVar5 - 0xf];
        iVar29 = 1 << ((byte)uVar5 & 0x1f);
        puVar11[1] = iVar29;
        puVar11[2] = iVar29 + -1;
        if ((*(void **)(puVar11 + 4) == (void *)0x0) || (iVar22 != iVar29)) {
          free(*(void **)(puVar11 + 4));
          pvVar24 = malloc((long)(int)puVar11[1]);
          *(void **)(puVar11 + 4) = pvVar24;
          if (pvVar24 != (void *)0x0) {
            free(*(void **)(puVar11 + 0x18));
            pvVar24 = malloc((long)(int)uVar43 * 8);
            *(void **)(puVar11 + 0x18) = pvVar24;
            if (pvVar24 != (void *)0x0) goto LAB_00144458;
          }
        }
        else {
LAB_00144458:
          lVar31 = 0;
          do {
            *(int *)((long)&local_d8[0].cache_buffer + lVar31 * 4) = 1 << ((byte)lVar31 & 0x1f);
            lVar31 = lVar31 + 1;
          } while (lVar31 != 0x12);
          lVar31 = *(long *)(puVar11 + 0x18);
          uVar32 = 1;
          if (1 < (int)uVar43) {
            uVar32 = (ulong)uVar43;
          }
          uVar38 = 0;
          uVar39 = 0;
          uVar18 = 0;
          do {
            if (uVar39 == 0) {
              uVar18 = (uint)uVar38;
            }
            else {
              uVar18 = uVar18 + *(int *)((long)&local_d8[0].cache_buffer + (ulong)uVar39 * 4);
            }
            if (uVar39 < 0x11) {
              uVar39 = 0xfffffffe;
              uVar7 = uVar18;
              if (uVar18 != 0) {
                do {
                  uVar39 = uVar39 + 1;
                  bVar13 = 1 < uVar7;
                  uVar7 = (int)uVar7 >> 1;
                } while (bVar13);
              }
              if ((int)uVar39 < 1) {
                uVar39 = 0;
              }
            }
            *(uint *)(lVar31 + uVar38 * 8) = uVar18;
            *(uint *)(lVar31 + 4 + uVar38 * 8) = uVar39;
            uVar38 = uVar38 + 1;
          } while (uVar38 != uVar32);
          puVar11[6] = 0;
          *puVar11 = 0;
          *(undefined8 *)(puVar11 + 0x1a) = 0;
          puVar11[0x1c] = 0;
          puVar11[0x12] = 1;
          *(undefined8 *)(puVar11 + 0x10) = 0x100000001;
          wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x1e),8,L'\b');
          if ((((wVar17 == L'\0') &&
               (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x6c),0x14,L'\n'), wVar17 == L'\0'))
              && (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x52),
                                            (long)(int)(uVar43 * 8 + 0x100),L'\x10'),
                 wVar17 == L'\0')) &&
             (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x38),0xf9,L'\x10'), wVar17 == L'\0'))
          {
            puVar11[0x87] = 0;
            *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
            goto LAB_00142f13;
          }
        }
      }
    }
    pcVar35 = "Can\'t initialize LZX decompression.";
  }
  else {
    if (sVar3 != 1) {
      if (sVar3 != 0) {
        archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                          *(undefined8 *)(lVar8 + 0x10));
        *avail = -0x19;
        return (void *)0x0;
      }
      lVar8 = *(long *)((long)a->format->data + 0x38);
      pvVar23 = __archive_read_ahead(a,1,avail);
      if (0 < *avail) {
        if ((long)(ulong)*(ushort *)(lVar8 + 10) < *avail) {
          *avail = (ulong)*(ushort *)(lVar8 + 10);
        }
        *(undefined2 *)(lVar8 + 0xc) = *(undefined2 *)(lVar8 + 8);
        *(ssize_t *)(lVar8 + 0x10) = *avail;
        *(void **)(lVar8 + 0x38) = pvVar23;
        return pvVar23;
      }
      pcVar35 = "Truncated CAB header";
      iVar22 = 0x54;
LAB_001445bd:
      archive_set_error(&a->archive,iVar22,pcVar35);
      *avail = -0x1e;
      return (void *)0x0;
    }
    pvVar23 = a->format->data;
    lVar8 = *(long *)((long)pvVar23 + 0x38);
    if (*(long *)((long)pvVar23 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 == (void *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for CAB reader");
        *avail = -0x1e;
        return (void *)0x0;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar5 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar23 + 0xa0);
      *avail = (ulong)uVar4 - (ulong)uVar5;
      return (void *)((ulong)uVar5 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) != '\0') {
LAB_00142cb6:
      uVar43 = (uint)(*(short *)(lVar8 + 6) == *(short *)(lVar8 + 4)) * 2;
      strm = (z_streamp)((long)pvVar23 + 0x110);
      *(ulong *)((long)pvVar23 + 0x138) = (ulong)uVar4;
      uVar18 = 0;
LAB_00142ced:
      uVar30 = *(ulong *)((long)pvVar23 + 0x138);
      uVar4 = *(ushort *)(lVar8 + 8);
      if (uVar30 < uVar4) {
        *(ulong *)((long)pvVar23 + 0x128) = *(long *)((long)pvVar23 + 0xa0) + uVar30;
        *(uint *)((long)pvVar23 + 0x130) = (uint)uVar4 - (int)uVar30;
        pcVar35 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_d8);
        if ((long)local_d8[0].cache_buffer < 1) {
          bVar13 = false;
          archive_set_error(&a->archive,0x54,"Truncated CAB header");
LAB_00142e2a:
          *avail = -0x1e;
          uVar33 = 1;
        }
        else {
          if ((long)(ulong)*(ushort *)(lVar8 + 6) < (long)local_d8[0].cache_buffer) {
            local_d8[0].cache_buffer = (ulong)*(ushort *)(lVar8 + 6);
          }
          *(char **)((long)pvVar23 + 0x110) = pcVar35;
          *(int *)((long)pvVar23 + 0x118) = (int)local_d8[0].cache_buffer;
          *(undefined8 *)((long)pvVar23 + 0x120) = 0;
          if ((int)uVar43 < 1) {
LAB_00142de8:
            uVar18 = cm_zlib_inflate(strm,0);
            if (uVar18 == 0) {
              bVar13 = false;
            }
            else {
              uVar36 = 6;
              if (uVar18 != 1) goto LAB_00142ebb;
              bVar13 = true;
            }
            iVar25 = *(int64_t *)((long)pvVar23 + 0x120);
            *(int64_t *)(lVar8 + 0x10) = iVar25;
            *(char **)(lVar8 + 0x38) = pcVar35;
            iVar25 = cab_minimum_consume_cfdata(a,iVar25);
            if (iVar25 < 0) goto LAB_00142e2a;
            uVar33 = 0;
          }
          else {
            uVar36 = 4;
            uVar33 = 4;
            if (0 < (long)local_d8[0].cache_buffer) {
              uVar30 = (ulong)uVar43;
              if ((long)uVar30 < (long)local_d8[0].cache_buffer) {
                if (uVar43 == 2) {
                  if ((*pcVar35 != 'C') || (pcVar35[1] != 'K')) goto LAB_00142e5c;
                }
                else if ((uVar43 == 1) && (*pcVar35 != 'K')) {
                  uVar43 = 1;
                  goto LAB_00142ebb;
                }
                *(char **)((long)pvVar23 + 0x110) = pcVar35 + uVar30;
                *(uint *)((long)pvVar23 + 0x118) = (int)local_d8[0].cache_buffer - uVar43;
                *(ulong *)((long)pvVar23 + 0x120) = uVar30;
                uVar43 = 0;
                goto LAB_00142de8;
              }
              if (uVar43 == 2) {
                if ((*pcVar35 != 'C') || ((local_d8[0].cache_buffer != 1 && (pcVar35[1] != 'K')))) {
LAB_00142e5c:
                  bVar13 = false;
                  uVar43 = 2;
                  goto LAB_00142ec1;
                }
              }
              else if (*pcVar35 != 'K') goto LAB_00142ebb;
              *(uint64_t *)(lVar8 + 0x10) = local_d8[0].cache_buffer;
              *(char **)(lVar8 + 0x38) = pcVar35;
              iVar25 = cab_minimum_consume_cfdata(a,local_d8[0].cache_buffer);
              if (iVar25 < 0) {
                *avail = -0x1e;
                uVar33 = 1;
                bVar13 = false;
                goto LAB_00142ec1;
              }
              uVar43 = uVar43 - (int)local_d8[0].cache_buffer;
              uVar36 = 2;
            }
LAB_00142ebb:
            uVar33 = uVar36;
            bVar13 = false;
          }
        }
LAB_00142ec1:
        switch(uVar33) {
        case 0:
        case 2:
          goto switchD_00142eda_caseD_0;
        default:
          goto LAB_001446bb;
        case 4:
          archive_set_error(&a->archive,-1,"CFDATA incorrect(no MSZIP signature)");
          *avail = -0x1e;
          return (void *)0x0;
        case 6:
          goto LAB_00144715;
        }
      }
      goto LAB_00144307;
    }
    *(undefined8 *)((long)pvVar23 + 0x110) = 0;
    *(undefined4 *)((long)pvVar23 + 0x118) = 0;
    *(undefined8 *)((long)pvVar23 + 0x138) = 0;
    *(undefined8 *)((long)pvVar23 + 0x120) = 0;
    *(undefined8 *)((long)pvVar23 + 0x128) = 0;
    *(undefined4 *)((long)pvVar23 + 0x130) = 0;
    if (*(char *)((long)pvVar23 + 0x180) == '\0') {
      iVar22 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar23 + 0x110),-0xf,"1.3.1",0x70);
    }
    else {
      iVar22 = cm_zlib_inflateReset((z_streamp)((long)pvVar23 + 0x110));
    }
    if (iVar22 == 0) {
      *(undefined1 *)((long)pvVar23 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
      goto LAB_00142cb6;
    }
    pcVar35 = "Can\'t initialize deflate decompression.";
  }
  archive_set_error(&a->archive,-1,pcVar35);
LAB_001446b0:
  *avail = -0x1e;
  return (void *)0x0;
switchD_001430bc_caseD_4:
  uVar43 = piVar10[0x1c];
  if ((uVar43 & 0xf) == 0) {
    if ((((int)uVar43 < 0x10) && (wVar17 = lzx_br_fillup(strm_00,br), wVar17 == L'\0')) &&
       (piVar10[0x1c] < 0x10)) {
      *piVar10 = 4;
      goto LAB_001440ba;
    }
    uVar43 = piVar10[0x1c] - 0x10;
  }
  else {
    uVar43 = uVar43 & 0xfffffff0;
  }
  piVar10[0x1c] = uVar43;
  piVar10[0x14] = 0;
  *piVar10 = 5;
switchD_001430bc_caseD_5:
  do {
    iVar29 = piVar10[0x1c];
    if (iVar29 < 0x20) {
      if (0xf < iVar29) {
        uVar38 = br->cache_buffer;
        iVar41 = 2;
        iVar28 = -0x10;
        puVar37 = (undefined1 *)((long)piVar10 + 0x4d);
        piVar42 = piVar10 + 0x13;
        goto LAB_00143c0b;
      }
    }
    else {
      uVar38 = *(ulong *)(piVar10 + 0x1a);
      uVar34 = uVar38 >> ((byte)(iVar29 + -0x10) & 0x3f);
      piVar10[0x1c] = iVar29 + -0x10;
      *(char *)(piVar10 + 0x13) = (char)uVar34;
      *(char *)((long)piVar10 + 0x4d) = (char)(uVar34 >> 8);
      iVar41 = 4;
      iVar28 = -0x20;
      puVar37 = (undefined1 *)((long)piVar10 + 0x4f);
      piVar42 = (int *)((long)piVar10 + 0x4e);
LAB_00143c0b:
      uVar38 = uVar38 >> ((byte)(iVar29 + iVar28) & 0x3f);
      piVar10[0x1c] = iVar29 + iVar28;
      *(char *)piVar42 = (char)uVar38;
      *puVar37 = (char)(uVar38 >> 8);
      piVar10[0x14] = iVar41;
    }
    iVar29 = piVar10[0x14];
    if (((long)iVar29 < 4) && (*(char *)((long)piVar10 + 0x75) != '\0')) {
      piVar10[0x14] = iVar29 + 1;
      *(char *)((long)piVar10 + (long)iVar29 + 0x4c) = (char)piVar10[0x1d];
      *(undefined1 *)((long)piVar10 + 0x75) = 0;
    }
    iVar29 = piVar10[0x14];
    while (iVar29 < 4) {
      iVar28 = iVar22;
      if (*(long *)((long)pvVar23 + 400) < 1) goto LAB_00143d43;
      puVar37 = *(undefined1 **)((long)pvVar23 + 0x188);
      *(undefined1 **)((long)pvVar23 + 0x188) = puVar37 + 1;
      uVar2 = *puVar37;
      piVar10[0x14] = iVar29 + 1;
      *(undefined1 *)((long)piVar10 + (long)iVar29 + 0x4c) = uVar2;
      *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
      iVar29 = piVar10[0x14];
    }
    piVar10[0x14] = 0;
    iVar29 = *piVar10;
    iVar28 = 0;
    if (iVar29 == 7) {
      uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
      piVar10[0x12] =
           (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
           (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) | uVar43;
      iVar29 = 8;
LAB_00143d36:
      if ((int)uVar43 < 0) {
        iVar28 = 5;
      }
      else {
        *piVar10 = iVar29;
      }
    }
    else {
      if (iVar29 == 6) {
        uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x11] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar43;
        iVar29 = 7;
        goto LAB_00143d36;
      }
      if (iVar29 == 5) {
        uVar43 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x10] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar43;
        iVar29 = 6;
        goto LAB_00143d36;
      }
    }
LAB_00143d43:
    if (iVar28 != 0) goto joined_r0x00143e2c;
  } while (*piVar10 != 8);
switchD_001430bc_caseD_8:
  do {
    if (*(long *)(piVar10 + 0xe) == 0) goto switchD_001430bc_caseD_9;
    uVar38 = *(ulong *)((long)pvVar23 + 0x1a8);
    if ((long)uVar38 < 1) {
      iVar28 = 1;
    }
    else {
      uVar34 = *(ulong *)((long)pvVar23 + 400);
      iVar28 = iVar22;
      if (0 < (long)uVar34) {
        uVar18 = (uint)*(long *)(piVar10 + 0xe);
        uVar43 = piVar10[1] - piVar10[6];
        if ((int)uVar18 <= piVar10[1] - piVar10[6]) {
          uVar43 = uVar18;
        }
        if ((long)(int)uVar43 <= (long)uVar38) {
          uVar38 = (ulong)uVar43;
        }
        if ((long)(int)uVar38 <= (long)uVar34) {
          uVar34 = uVar38 & 0xffffffff;
        }
        __n = (size_t)(int)uVar34;
        memcpy(*(void **)((long)pvVar23 + 0x1a0),*(void **)((long)pvVar23 + 0x188),__n);
        memcpy((void *)((long)piVar10[6] + *(long *)(piVar10 + 4)),*(void **)((long)pvVar23 + 0x188)
               ,__n);
        *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + __n;
        *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) - __n;
        *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + __n;
        *(long *)((long)pvVar23 + 0x1a8) = *(long *)((long)pvVar23 + 0x1a8) - __n;
        *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + __n;
        piVar10[6] = piVar10[6] + (int)uVar34 & piVar10[2];
        *(size_t *)(piVar10 + 0xe) = *(long *)(piVar10 + 0xe) - __n;
        iVar28 = 0;
      }
    }
  } while (iVar28 == 0);
joined_r0x00143e2c:
  if (iVar28 != 5) {
LAB_001440d7:
    uVar43 = 0;
    goto LAB_0014414e;
  }
LAB_001440c6:
  piVar10[0x87] = -0x19;
  uVar43 = 0xffffffe7;
  goto LAB_0014414e;
switchD_001430bc_caseD_9:
  if ((*(byte *)(piVar10 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar23 + 400) < 1) {
      *piVar10 = 9;
LAB_001440ba:
      if (uVar32 != uVar30) goto LAB_001440d7;
      goto LAB_001440c6;
    }
    *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + 1;
    *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
  }
  *piVar10 = 2;
  uVar43 = 1;
LAB_0014414e:
  if (uVar43 != 100) goto code_r0x0014415c;
  goto LAB_00143091;
code_r0x001435ca:
  uVar36 = 0x15;
  uVar43 = local_164;
  if (local_158 == 0) goto switchD_0014333b_default;
  if (local_158 == 2) {
    local_158 = 2;
    uVar43 = local_13c;
    uVar27 = local_164;
    local_164 = local_13c;
    goto switchD_0014333b_default;
  }
  if (local_158 == 1) {
    local_158 = 1;
    uVar43 = local_144;
    uVar14 = local_164;
    local_164 = local_144;
    goto switchD_0014333b_default;
  }
  local_88 = (ulong)*(uint *)(local_58 + 4 + (long)(int)local_158 * 8);
LAB_00143649:
  wVar45 = (wchar_t)local_88;
  if ((cVar1 == '\x02') && (L'\x02' < wVar45)) {
    wVar45 = wVar45 + L'\xfffffffd';
    if (((wVar45 <= local_d8[0].cache_avail) ||
        (wVar20 = lzx_br_fillup(strm_00,local_d8), wVar20 != L'\0')) ||
       (uVar36 = 0x14, uVar43 = local_68, wVar45 <= local_d8[0].cache_avail)) {
      uVar40 = ((uint)(local_d8[0].cache_buffer >>
                      ((char)local_d8[0].cache_avail - (char)wVar45 & 0x3fU)) &
               cache_masks[(uint)wVar45]) * 8;
      wVar20 = (int)local_78 + wVar45;
      uVar36 = uVar33;
      if (((local_d8[0].cache_avail < wVar20) &&
          (wVar21 = lzx_br_fillup(strm_00,local_d8), wVar21 == L'\0')) &&
         (local_d8[0].cache_avail < wVar20)) {
        if (uVar32 == uVar30) {
          uVar4 = *(ushort *)
                   (*(long *)(puVar11 + 0x36) +
                   (ulong)((uint)(local_d8[0].cache_buffer <<
                                 ((char)local_78 - (char)(local_d8[0].cache_avail - wVar45) & 0x3fU)
                                 ) & cache_masks[local_78]) * 2);
          uVar34 = (ulong)uVar4;
          if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
            uVar34 = 0;
          }
          local_d8[0].cache_avail =
               (local_d8[0].cache_avail - wVar45) - (uint)*(byte *)(local_60 + uVar34);
          if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_001438cb;
          uVar43 = 8;
        }
        else {
          uVar43 = 7;
          uVar36 = 0x14;
        }
      }
      else {
        uVar4 = *(ushort *)
                 (*(long *)(puVar11 + 0x36) +
                 (ulong)((uint)(local_d8[0].cache_buffer >>
                               ((char)(local_d8[0].cache_avail - wVar45) - (char)local_78 & 0x3fU))
                        & cache_masks[local_78]) * 2);
        uVar34 = (ulong)uVar4;
        if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
          uVar34 = 0;
        }
        local_d8[0].cache_avail =
             (local_d8[0].cache_avail - wVar45) - (uint)*(byte *)(local_60 + uVar34);
LAB_001438cb:
        uVar40 = (int)uVar34 + uVar40;
        uVar43 = 0;
      }
    }
    uVar33 = uVar36;
    if (uVar43 != 0) {
      if (uVar43 == 7) goto LAB_00143a7a;
      if (uVar43 != 8) goto LAB_0014412c;
LAB_00144117:
      puVar11[0x87] = 0xffffffe7;
      uVar43 = 0xffffffe7;
LAB_0014412c:
      lVar31 = local_38 - *(long *)((long)pvVar23 + 0x1a8);
      *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + lVar31;
      *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + lVar31;
      goto LAB_0014414e;
    }
  }
  else {
    if ((local_d8[0].cache_avail < wVar45) &&
       ((wVar45 = lzx_br_fillup(strm_00,local_d8), wVar45 == L'\0' &&
        (local_d8[0].cache_avail < (wchar_t)local_88)))) {
      uVar33 = 0x14;
      if (uVar32 == uVar30) goto LAB_00144117;
      goto LAB_00143a7a;
    }
    local_d8[0].cache_avail = local_d8[0].cache_avail - (int)local_88;
    uVar40 = (uint)(local_d8[0].cache_buffer >> ((byte)local_d8[0].cache_avail & 0x3f)) &
             cache_masks[(int)local_88];
  }
  uVar40 = (uVar40 + *(int *)(local_58 + (long)(int)local_158 * 8)) - 2;
  local_13c = local_144;
  uVar15 = uVar40;
  local_144 = local_164;
switchD_0014333b_caseD_15:
  local_164 = uVar15;
  uVar40 = uVar39 - uVar40 & uVar7;
switchD_0014333b_caseD_16:
  uVar36 = uVar33;
  do {
    uVar43 = uVar39;
    if ((int)uVar39 < (int)uVar40) {
      uVar43 = uVar40;
    }
    uVar27 = local_64 - uVar43;
    if ((int)uVar18 < (int)(local_64 - uVar43)) {
      uVar27 = uVar18;
    }
    if (puVar37 <= __dest + (int)uVar27) {
      uVar27 = (int)puVar37 - (int)__dest;
    }
    pvVar24 = (void *)((int)uVar40 + lVar31);
    if (((int)uVar27 < 8) ||
       (((int)uVar39 <= (int)(uVar40 + uVar27) && ((int)uVar40 <= (int)(uVar39 + uVar27))))) {
      if (0 < (int)uVar27) {
        uVar34 = 0;
        do {
          uVar2 = *(undefined1 *)((long)pvVar24 + uVar34);
          *(undefined1 *)((int)uVar39 + lVar31 + uVar34) = uVar2;
          __dest[uVar34] = uVar2;
          uVar34 = uVar34 + 1;
        } while (uVar27 != uVar34);
      }
    }
    else {
      local_40 = (size_t)uVar27;
      memcpy((void *)((int)uVar39 + lVar31),pvVar24,local_40);
      memcpy(__dest,pvVar24,local_40);
    }
    __dest = __dest + (int)uVar27;
    uVar40 = uVar40 + uVar27 & uVar7;
    uVar39 = uVar39 + uVar27 & uVar7;
    uVar38 = uVar38 - (long)(int)uVar27;
    uVar33 = 0x16;
    if (__dest < puVar37) {
      uVar33 = uVar36;
    }
    iVar29 = 7;
    if (__dest < puVar37) {
      iVar29 = 0;
    }
    uVar14 = uVar27;
    if ((int)uVar18 <= (int)uVar27) {
      uVar33 = uVar36;
      uVar14 = 0;
    }
    uVar43 = 10;
    if ((int)uVar18 <= (int)uVar27) {
      iVar29 = 10;
    }
    uVar18 = uVar18 - uVar14;
    uVar36 = uVar33;
  } while (iVar29 == 0);
  if (iVar29 != 7) {
    if (iVar29 != 10) goto LAB_0014412c;
    uVar36 = 0x12;
    uVar43 = uVar40;
    uVar27 = local_13c;
    uVar14 = local_144;
    goto switchD_0014333b_default;
  }
LAB_00143a7a:
  *local_48 = (int)local_d8[0].cache_buffer;
  local_48[1] = local_d8[0].cache_buffer._4_4_;
  local_48[2] = local_d8[0].cache_avail;
  local_48[3] = local_d8[0]._12_4_;
  *(ulong *)(puVar11 + 0xe) = uVar38;
  puVar11[8] = uVar18;
  puVar11[7] = uVar40;
  puVar11[0x15] = uVar19;
  puVar11[0x17] = (int)local_88;
  puVar11[0x16] = local_158;
  puVar11[0x10] = local_164;
  puVar11[0x11] = local_144;
  puVar11[0x12] = local_13c;
  *puVar11 = uVar33;
  puVar11[6] = uVar39;
  *(long *)((long)pvVar23 + 0x1a8) = (long)puVar37 - (long)__dest;
  uVar43 = 0;
  goto LAB_0014412c;
code_r0x0014415c:
  *(long *)((long)pvVar23 + 0x198) =
       *(long *)((long)pvVar23 + 0x198) + (uVar32 - *(long *)((long)pvVar23 + 400));
LAB_0014416f:
  if (1 < uVar43) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_00144783;
  }
  iVar25 = *(int64_t *)((long)pvVar23 + 0x198);
  *(int64_t *)(lVar8 + 0x10) = iVar25;
  *(byte **)(lVar8 + 0x38) = local_80;
  iVar25 = cab_minimum_consume_cfdata(a,iVar25);
  if (iVar25 < 0) goto LAB_00144783;
  uVar30 = *(ulong *)((long)pvVar23 + 0x1b0);
  uVar32 = (ulong)*(ushort *)(lVar8 + 8);
  if ((long)uVar32 <= (long)uVar30) goto LAB_001441bf;
  goto LAB_00142f49;
switchD_00142eda_caseD_0:
  if (bVar13) goto LAB_00144307;
  goto LAB_00142ced;
LAB_00144307:
  uVar30 = *(ulong *)((long)pvVar23 + 0x138);
  uVar32 = uVar30 & 0xffff;
  if ((uint)*(ushort *)(lVar8 + 8) <= (uint)uVar32) {
    if (*(short *)(lVar8 + 6) != 0) {
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        archive_set_error(&a->archive,0x54,"Truncated CAB header");
        goto LAB_001447ad;
      }
      *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
      *(void **)(lVar8 + 0x38) = pvVar24;
      iVar25 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
      if (iVar25 < 0) goto LAB_001447ad;
    }
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar23 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58)) ||
       ((uVar18 = cm_zlib_inflateReset(strm), uVar18 == 0 &&
        (uVar18 = cm_zlib_inflateSetDictionary
                            (strm,*(Bytef **)((long)pvVar23 + 0xa0),(uint)*(ushort *)(lVar8 + 8)),
        uVar18 == 0)))) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar31 = *(long *)((long)pvVar23 + 0xa0);
      *avail = uVar32 - uVar4;
      *(short *)(lVar8 + 0xc) = (short)uVar30;
      return (void *)((ulong)uVar4 + lVar31);
    }
LAB_00144715:
    if (uVar18 == 0xfffffffc) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar18);
    }
LAB_001447ad:
    *avail = -0x1e;
    return (void *)0x0;
  }
  archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar32);
  goto LAB_001446b0;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}